

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPU.cpp
# Opt level: O0

void __thiscall PPU::incrementY(PPU *this)

{
  int iVar1;
  int y;
  PPU *this_local;
  
  if ((this->vramCur & 0x7000) == 0x7000) {
    this->vramCur = this->vramCur & 0x8fff;
    iVar1 = (int)(this->vramCur & 0x3e0) >> 5;
    if (iVar1 == 0x1d) {
      y = 0;
      this->vramCur = this->vramCur ^ 0x800;
    }
    else {
      y = iVar1 + 1U & 0x1f;
    }
    this->vramCur = this->vramCur & 0xfc1f | (ushort)(y << 5);
  }
  else {
    this->vramCur = this->vramCur + 0x1000;
  }
  return;
}

Assistant:

void PPU::incrementY() {
    if ((vramCur & 0x7000) == 0x7000) {
        vramCur &= ~0x7000;
        int y = (vramCur & 0x03E0) >> 5;
        if (y == 29) {
            y = 0;
            vramCur ^= 0x0800;
        } else {
            y = (y + 1) & 31;
        }
        vramCur = (vramCur & ~0x03E0) | (y << 5);
    } else {
        vramCur += 0x1000;
    }
}